

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_js_generator.cc
# Opt level: O0

string * __thiscall
t_js_generator::function_signature
          (string *__return_storage_ptr__,t_js_generator *this,t_function *tfunction,string *prefix,
          bool include_callback)

{
  string *__rhs;
  t_struct *tstruct;
  string local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  undefined1 local_2a;
  byte local_29;
  string *psStack_28;
  bool include_callback_local;
  string *prefix_local;
  t_function *tfunction_local;
  t_js_generator *this_local;
  string *str;
  
  local_2a = 0;
  local_29 = include_callback;
  psStack_28 = prefix;
  prefix_local = (string *)tfunction;
  tfunction_local = (t_function *)this;
  this_local = (t_js_generator *)__return_storage_ptr__;
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  __rhs = t_function::get_name_abi_cxx11_((t_function *)prefix_local);
  std::operator+(&local_70,prefix,__rhs);
  std::operator+(&local_50,&local_70," = function(");
  std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_70);
  tstruct = t_function::get_arglist((t_function *)prefix_local);
  argument_list_abi_cxx11_(&local_a0,this,tstruct,(bool)(local_29 & 1));
  std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_a0);
  std::__cxx11::string::~string((string *)&local_a0);
  std::__cxx11::string::operator+=((string *)__return_storage_ptr__,")");
  return __return_storage_ptr__;
}

Assistant:

string t_js_generator::function_signature(t_function* tfunction,
                                          string prefix,
                                          bool include_callback) {

  string str;

  str = prefix + tfunction->get_name() + " = function(";

  str += argument_list(tfunction->get_arglist(), include_callback);

  str += ")";
  return str;
}